

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::SplitPath
               (string *p,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,bool expand_home_dir)

{
  char *__beg;
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  reference pcVar5;
  bool bVar6;
  allocator<char> local_109;
  value_type local_108;
  allocator<char> local_e1;
  value_type local_e0;
  char *local_c0;
  char *last;
  char *first;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8 [8];
  passwd *local_a0;
  passwd *pw;
  undefined1 local_78 [8];
  string homedir;
  undefined1 local_48 [8];
  string root;
  char *c;
  bool expand_home_dir_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components_local;
  string *p_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(components);
  std::__cxx11::string::string((string *)local_48);
  root.field_2._8_8_ = SplitPathRootComponent(p,(string *)local_48);
  if (((expand_home_dir) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar3 == '~')) {
    std::__cxx11::string::string((string *)local_78);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&pw,(ulong)local_48);
    std::__cxx11::string::operator=((string *)local_48,(string *)&pw);
    std::__cxx11::string::~string((string *)&pw);
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 1) {
      GetEnv("HOME",(string *)local_78);
    }
    else {
      lVar4 = std::__cxx11::string::c_str();
      local_a0 = getpwnam((char *)(lVar4 + 1));
      if ((local_a0 != (passwd *)0x0) && (local_a0->pw_dir != (char *)0x0)) {
        std::__cxx11::string::operator=((string *)local_78,local_a0->pw_dir);
      }
    }
    uVar1 = std::__cxx11::string::empty();
    bVar6 = false;
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::rbegin();
      pcVar5 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(local_a8);
      bVar6 = true;
      if (*pcVar5 != '/') {
        std::__cxx11::string::rbegin();
        pcVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&first);
        bVar6 = *pcVar5 == '\\';
      }
    }
    if (bVar6) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)local_78);
    }
    SplitPath((string *)local_78,components,true);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,(value_type *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  last = (char *)root.field_2._8_8_;
  for (local_c0 = (char *)root.field_2._8_8_; __beg = last, pcVar3 = local_c0, *local_c0 != '\0';
      local_c0 = local_c0 + 1) {
    if ((*local_c0 == '/') || (*local_c0 == '\\')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&local_e0,__beg,pcVar3,&local_e1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(components,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      last = local_c0 + 1;
    }
  }
  if (local_c0 != (char *)root.field_2._8_8_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_108,__beg,pcVar3,&local_109);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(components,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  return;
}

Assistant:

void SystemTools::SplitPath(const std::string& p,
                            std::vector<std::string>& components,
                            bool expand_home_dir)
{
  const char* c;
  components.clear();

  // Identify the root component.
  {
    std::string root;
    c = SystemTools::SplitPathRootComponent(p, &root);

    // Expand home directory references if requested.
    if (expand_home_dir && !root.empty() && root[0] == '~') {
      std::string homedir;
      root = root.substr(0, root.size() - 1);
      if (root.size() == 1) {
#if defined(_WIN32) && !defined(__CYGWIN__)
        if (!SystemTools::GetEnv("USERPROFILE", homedir))
#endif
          SystemTools::GetEnv("HOME", homedir);
      }
#ifdef HAVE_GETPWNAM
      else if (passwd* pw = getpwnam(root.c_str() + 1)) {
        if (pw->pw_dir) {
          homedir = pw->pw_dir;
        }
      }
#endif
      if (!homedir.empty() &&
          (*homedir.rbegin() == '/' || *homedir.rbegin() == '\\')) {
        homedir.resize(homedir.size() - 1);
      }
      SystemTools::SplitPath(homedir, components);
    } else {
      components.push_back(root);
    }
  }

  // Parse the remaining components.
  const char* first = c;
  const char* last = first;
  for (; *last; ++last) {
    if (*last == '/' || *last == '\\') {
      // End of a component.  Save it.
      components.push_back(std::string(first, last));
      first = last + 1;
    }
  }

  // Save the last component unless there were no components.
  if (last != c) {
    components.push_back(std::string(first, last));
  }
}